

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpanTests.cpp
# Opt level: O1

int testSpanTestsIterationDynamicSlices(void)

{
  long lVar1;
  size_t sVar2;
  pointer ptVar3;
  long lVar4;
  ostream *poVar5;
  uint uVar6;
  ulong uVar7;
  pointer ptVar8;
  bool bVar9;
  bool bVar10;
  initializer_list<int> __l;
  vector<int,_std::allocator<int>_> values;
  Span<const_int,_18446744073709551615UL> span;
  vector<int,_std::allocator<int>_> local_80;
  IteratorProvider<MILBlob::Util::Span<const_int,_18446744073709551615UL>::SliceIterator> local_68;
  Span<const_int,_18446744073709551615UL> local_40;
  
  local_68.m_begin.m_ptr = (pointer)0x200000001;
  local_68.m_begin.m_stride = 0x400000003;
  local_68.m_end.m_ptr = (pointer)0x600000005;
  __l._M_len = 6;
  __l._M_array = (iterator)&local_68;
  std::vector<int,_std::allocator<int>_>::vector(&local_80,__l,(allocator_type *)&local_40);
  local_40.m_ptr = (pointer)0x0;
  if ((long)local_80.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish -
      (long)local_80.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start != 0) {
    local_40.m_ptr =
         local_80.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_start;
  }
  local_40.m_size.m_size =
       (long)local_80.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_finish -
       (long)local_80.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start >> 2;
  MILBlob::Util::Span<const_int,_18446744073709551615UL>::IterateSlices(&local_68,&local_40,3);
  ptVar3 = local_68.m_end.m_ptr;
  sVar2 = local_68.m_begin.m_stride;
  uVar7 = local_68.m_end.m_stride ^ local_68.m_begin.m_stride;
  uVar6 = 0;
  bVar10 = local_68.m_begin.m_ptr != local_68.m_end.m_ptr || uVar7 != 0;
  if (local_68.m_begin.m_ptr != local_68.m_end.m_ptr || uVar7 != 0) {
    lVar1 = local_68.m_begin.m_stride * 4;
    ptVar8 = local_68.m_begin.m_ptr;
    do {
      if (sVar2 == 3) {
        lVar4 = 0;
        do {
          uVar6 = uVar6 + 1;
          if (uVar6 != *(uint *)((long)ptVar8 + lVar4)) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/MILBlob/SpanTests.cpp"
                       ,0x71);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
            poVar5 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x264);
            std::__ostream_insert<char,std::char_traits<char>>(poVar5,": error: ",9);
            std::__ostream_insert<char,std::char_traits<char>>(poVar5,"(i) == (++counter)",0x12);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar5," was false, expected true.",0x1a);
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
            std::ostream::put((char)poVar5);
            std::ostream::flush();
            goto LAB_001ce7e0;
          }
          lVar4 = lVar4 + 4;
          bVar9 = lVar1 - lVar4 == 0;
        } while (!bVar9);
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/MILBlob/SpanTests.cpp"
                   ,0x71);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
        poVar5 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x261);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,": error: ",9);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar5,"(row.Size()) == (size_t(3))",0x1b);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5," was false, expected true.",0x1a)
        ;
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
        std::ostream::put((char)poVar5);
        std::ostream::flush();
LAB_001ce7e0:
        bVar9 = false;
      }
      if (!bVar9) break;
      ptVar8 = ptVar8 + sVar2;
      bVar10 = ptVar8 != ptVar3 || uVar7 != 0;
    } while (bVar10);
    uVar6 = (uint)(uVar6 == 6);
  }
  if ((char)uVar6 == '\0' && bVar10 == false) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/MILBlob/SpanTests.cpp"
               ,0x71);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x267);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,": error: ",9);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"(counter) == (6)",0x10);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," was false, expected true.",0x1a);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
    std::ostream::put((char)poVar5);
    uVar6 = 1;
    std::ostream::flush();
  }
  else {
    uVar6 = (uint)bVar10;
  }
  if (local_80.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_80.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_80.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_80.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return uVar6;
}

Assistant:

int testSpanTestsIterationDynamicSlices()
{
    const std::vector<int> values = {1, 2, 3, 4, 5, 6};
    auto span = MakeSpan(values);

    // iterate 3 values at a time
    int counter = 0;
    for (auto row : span.IterateSlices(3)) {
        ML_ASSERT_EQ(row.Size(), size_t(3));

        for (auto i : row) {
            ML_ASSERT_EQ(i, ++counter);
        }
    }
    ML_ASSERT_EQ(counter, 6);

    return 0;
}